

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O0

void __thiscall Automaton::build(Automaton *this)

{
  _List_iterator<State> this_00;
  Automaton *in_RDI;
  long in_FS_OFFSET;
  pair<std::_List_iterator<Item>,_bool> pVar1;
  pair<std::_List_iterator<State>,_bool> pVar2;
  State tmp;
  Item item;
  Grammar *in_stack_ffffffffffffff28;
  State *this_01;
  State *in_stack_ffffffffffffff50;
  Automaton *this_02;
  Automaton *in_stack_ffffffffffffff58;
  Automaton *this_03;
  Automaton *this_04;
  _List_node_base *local_38;
  iterator iStack_30;
  _List_iterator<State> local_28;
  undefined1 local_20;
  _List_iterator<Item> local_18;
  undefined1 local_10;
  Bundle local_8;
  
  local_8.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
        )((totally_ordered_wrapper<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_*>
           *)(in_FS_OFFSET + 0x28))->ptr;
  local_38 = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
  iStack_30._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
  this_01 = (State *)&stack0xffffffffffffffc8;
  Item::Item((Item *)this_01);
  local_38 = (in_RDI->_M_grammar->goal)._M_node;
  std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x11ed82);
  iStack_30 = std::__cxx11::
              list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>::
              begin((list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
                     *)this_01);
  this_04 = (Automaton *)0xaaaaaaaaaaaaaaaa;
  this_03 = (Automaton *)0xaaaaaaaaaaaaaaaa;
  State::State(this_01,in_stack_ffffffffffffff28);
  pVar1 = State::insert((State *)in_stack_ffffffffffffff58,(Item *)in_stack_ffffffffffffff50);
  local_18 = pVar1.first._M_node;
  local_10 = pVar1.second;
  pVar2 = internState(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  this_00 = pVar2.first._M_node;
  local_20 = pVar2.second;
  (in_RDI->start)._M_node = this_00._M_node;
  this_02 = (Automaton *)(in_RDI->start)._M_node;
  local_28._M_node = this_00._M_node;
  closure(this_04,(StatePointer)item.dot._M_node);
  buildNullables(this_02);
  buildLookbackSets(this_03);
  buildReads((Automaton *)in_stack_ffffffffffffff28);
  buildIncludesAndFollows(in_RDI);
  buildLookaheads(this_02);
  buildDefaultReduceActions((Automaton *)this_00._M_node);
  State::~State(this_01);
  if ((QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_>
       )((totally_ordered_wrapper<QMapData<std::map<std::_List_iterator<QString>,_std::_List_iterator<State>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::pair<const_std::_List_iterator<QString>,_std::_List_iterator<State>_>_>_>_>_*>
          *)(in_FS_OFFSET + 0x28))->ptr == local_8.d.d.ptr) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Automaton::build ()
{
  Item item;
  item.rule = _M_grammar->goal;
  item.dot = _M_grammar->goal->rhs.begin ();

  State tmp (_M_grammar);
  tmp.insert (item);
  start = internState (tmp).first;

  closure (start);

  buildNullables ();
  buildLookbackSets ();
  buildReads ();
  buildIncludesAndFollows ();
  buildLookaheads ();
  buildDefaultReduceActions ();
}